

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  BVHNode *pBVar1;
  undefined8 *in_RDI;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_00000058;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_00000060;
  size_t in_stack_000004b8;
  size_t in_stack_000004c0;
  size_t in_stack_000004c8;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *in_stack_000004d0;
  BVHAccel *in_stack_000004d8;
  Aggregate *in_stack_ffffffffffffffc0;
  
  Aggregate::Aggregate(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_get_bbox_003bae10;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(in_stack_00000060,in_stack_00000058);
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  size((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
        *)(in_RDI + 1));
  pBVar1 = build_tree(in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,
                      in_stack_000004b8);
  in_RDI[4] = pBVar1;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
		size_t max_leaf_size) {
		this->primitives = _primitives;

		// TODO (PathTracer):
		// Construct a BVH from the given vector of primitives and maximum leaf
		// size configuration. The starter code build a BVH aggregate with a
		// single leaf node (which is also the root) that encloses all the
		// primitives.

		root = build_tree(this->primitives, 0, primitives.size(), max_leaf_size);
	}